

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QCborKnownTags tag)

{
  int *piVar1;
  char *pcVar2;
  char *pcVar3;
  storage_type *in_RCX;
  int in_EDX;
  undefined4 in_register_00000034;
  QDebug *dbg_00;
  QString *this;
  Stream *pSVar4;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  dbg_00 = (QDebug *)CONCAT44(in_register_00000034,tag);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,dbg_00);
  pcVar3 = qt_cbor_tag_id((long)in_EDX);
  pSVar4 = dbg_00->stream;
  pSVar4->space = false;
  if (pcVar3 == (char *)0x0) {
    ba_01.m_data = in_RCX;
    ba_01.m_size = (qsizetype)"QCborKnownTags(";
    QString::fromUtf8(&local_48,(QString *)0xf,ba_01);
    QTextStream::operator<<(&pSVar4->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (dbg_00->stream->space == true) {
      QTextStream::operator<<(&dbg_00->stream->ts,' ');
    }
    QTextStream::operator<<(&dbg_00->stream->ts,in_EDX);
    if (dbg_00->stream->space == true) {
      QTextStream::operator<<(&dbg_00->stream->ts,' ');
    }
    QTextStream::operator<<(&dbg_00->stream->ts,')');
    pSVar4 = dbg_00->stream;
    if (pSVar4->space != true) goto LAB_002eb12b;
  }
  else {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"QCborKnownTags::";
    QString::fromUtf8(&local_48,(QString *)0x10,ba);
    QTextStream::operator<<(&pSVar4->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (dbg_00->stream->space == true) {
      QTextStream::operator<<(&dbg_00->stream->ts,' ');
    }
    pSVar4 = dbg_00->stream;
    this = (QString *)0xffffffffffffffff;
    do {
      pcVar2 = pcVar3 + 1 + (long)this;
      this = (QString *)((long)&(this->d).d + 1);
    } while (*pcVar2 != '\0');
    ba_00.m_data = in_RCX;
    ba_00.m_size = (qsizetype)pcVar3;
    QString::fromUtf8(&local_48,this,ba_00);
    QTextStream::operator<<(&pSVar4->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pSVar4 = dbg_00->stream;
    if (pSVar4->space == false) goto LAB_002eb12b;
  }
  QTextStream::operator<<(&pSVar4->ts,' ');
LAB_002eb12b:
  pSVar4 = dbg_00->stream;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar4;
  piVar1 = &pSVar4->ref;
  *piVar1 = *piVar1 + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, QCborKnownTags tag)
{
    QDebugStateSaver saver(dbg);
    const char *id = qt_cbor_tag_id(QCborTag(int(tag)));
    if (id)
        return dbg.nospace() << "QCborKnownTags::" << id;

    return dbg.nospace() << "QCborKnownTags(" << int(tag) << ')';
}